

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O3

wchar_t hatch_last_embryo(parser *p)

{
  wchar_t wVar1;
  embryonic_ui_entry *embryo;
  
  embryo = (embryonic_ui_entry *)parser_priv(p);
  if (embryo == (embryonic_ui_entry *)0x0) {
    wVar1 = L'\0';
  }
  else {
    wVar1 = hatch_embryo(embryo);
    mem_free(embryo);
    parser_setpriv(p,(void *)0x0);
  }
  return wVar1;
}

Assistant:

static int hatch_last_embryo(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	int result = 0;

	if (embryo) {
		if (hatch_embryo(embryo)) {
			result = 1;
		}
		mem_free(embryo);
		parser_setpriv(p, NULL);
	}
	return result;
}